

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_lua.c
# Opt level: O2

int l_sqlite3_create_function(lua_State *L)

{
  sqlite3 *db;
  int iVar1;
  DB *db_00;
  CB_Data *p;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xSFunc;
  char *zFunc;
  int in_ECX;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *p_Var2;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xStep;
  _func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *xFinal;
  double dVar3;
  
  db_00 = (DB *)checkudata(L,1);
  p = get_named_cb_data(L,db_00,(void *)((long)&db_00->sqlite3 + 2),in_ECX);
  iVar1 = checknilornoneorfunc(L,4);
  p_Var2 = (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0;
  xSFunc = xfunc_callback_wrapper;
  if (iVar1 == 0) {
    xSFunc = p_Var2;
  }
  iVar1 = checknilornoneorfunc(L,5);
  xStep = xstep_callback_wrapper;
  if (iVar1 == 0) {
    xStep = p_Var2;
  }
  iVar1 = checknilornoneorfunc(L,6);
  xFinal = xfinal_callback_wrapper;
  if (iVar1 == 0) {
    xFinal = p_Var2;
  }
  register_callback(L,db_00,(void *)((long)&p->db + 1),4);
  register_callback(L,db_00,(void *)((long)&p->db + 2),5);
  register_callback(L,db_00,(void *)((long)&p->db + 3),6);
  db = db_00->sqlite3;
  zFunc = (char *)luaL_checklstring(L,2,0);
  dVar3 = (double)luaL_checknumber(L,3);
  iVar1 = sqlite3_create_function
                    (db,zFunc,(int)dVar3,1,p,xSFunc,xStep,(_func_void_sqlite3_context_ptr *)xFinal);
  lua_pushnumber((double)iVar1,L);
  return 1;
}

Assistant:

FUNC( l_sqlite3_create_function )
{
  DB * db		= checkdb(L, 1);
  CB_Data * cb_data	= get_function_cb_data(L, db, 2);
  
  void (*xfunc)(sqlite3_context *, int, sqlite3_value **) = 0;
  void (*xstep)(sqlite3_context *, int, sqlite3_value **) = 0;
  void (*xfinal)(sqlite3_context *) = 0;
  
  if ( checknilornoneorfunc(L, 4) )
    xfunc = xfunc_callback_wrapper;
  else
    xfunc = 0;
  
  if ( checknilornoneorfunc(L, 5) )
    xstep = xstep_callback_wrapper;
  else
    xstep = 0;
  
  if ( checknilornoneorfunc(L, 6) )
    xfinal = xfinal_callback_wrapper;
  else
    xfinal = 0;
  
  register_callback(L, db, KEY_XFUNC(cb_data), 4);
  register_callback(L, db, KEY_XSTEP(cb_data), 5);
  register_callback(L, db, KEY_XFINAL(cb_data), 6);
  
  lua_pushnumber(L,
    sqlite3_create_function (
      db->sqlite3,
      checkstr(L, 2),
      checkint(L, 3),
      SQLITE_UTF8,
      cb_data,
      xfunc,
      xstep,
      xfinal ));
  
  return 1;
}